

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O2

QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
* __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
::operator=(QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
            *this,QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
                  *other)

{
  QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>
  *pQVar1;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
  local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (other->d).ptr;
  if (pQVar1 != (QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  local_18 = (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
              )(this->d).ptr;
  (this->d).ptr = pQVar1;
  ~QExplicitlySharedDataPointerV2(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QExplicitlySharedDataPointerV2 &operator=(const QExplicitlySharedDataPointerV2 &other) noexcept
    {
        QExplicitlySharedDataPointerV2 copy(other);
        swap(copy);
        return *this;
    }